

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.h
# Opt level: O0

void __thiscall
mp::internal::
NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,mp::internal::VarBoundHandler<TestNLHandler3>>
::
ReadSuffix<mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,mp::internal::VarBoundHandler<TestNLHandler3>>::VarHandler>
          (NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_mp::internal::VarBoundHandler<TestNLHandler3>_>
           *this,int info)

{
  StringRef name_00;
  uint in_ESI;
  VarHandler *in_RDI;
  StringRef SVar1;
  IntSuffixHandler suffix_handler_1;
  DblSuffixHandler suffix_handler;
  Kind kind;
  StringRef name;
  int num_values;
  int num_items;
  NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_mp::internal::VarBoundHandler<TestNLHandler3>_>
  *in_stack_ffffffffffffff88;
  int in_stack_ffffffffffffff98;
  Kind in_stack_ffffffffffffff9c;
  NLHandler<mp::NullNLHandler<int>,_int> *in_stack_ffffffffffffffa0;
  uint in_stack_ffffffffffffffa8;
  uint in_stack_ffffffffffffffac;
  NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_mp::internal::VarBoundHandler<TestNLHandler3>_>
  *in_stack_ffffffffffffffb0;
  undefined8 in_stack_ffffffffffffffb8;
  NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_mp::internal::VarBoundHandler<TestNLHandler3>_>
  *in_stack_ffffffffffffffc0;
  NLHandler<mp::NullNLHandler<int>,_int> *local_30;
  NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_mp::internal::VarBoundHandler<TestNLHandler3>_>
  *local_28;
  VarHandler local_18;
  int local_10;
  uint local_c;
  
  local_c = in_ESI;
  NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_mp::internal::VarBoundHandler<TestNLHandler3>_>
  ::VarHandler::VarHandler(in_RDI,in_stack_ffffffffffffff88);
  local_10 = NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_mp::internal::VarBoundHandler<TestNLHandler3>_>
             ::VarHandler::num_items(&local_18);
  NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_mp::internal::VarBoundHandler<TestNLHandler3>_>
  ::ReadUInt(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8);
  SVar1 = BinaryReader<mp::internal::EndiannessConverter>::ReadName
                    ((BinaryReader<mp::internal::EndiannessConverter> *)0x256278);
  BinaryReaderBase::ReadTillEndOfLine
            ((BinaryReaderBase *)
             (in_RDI->
             super_ItemHandler<(mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_mp::internal::VarBoundHandler<TestNLHandler3>_>::ItemType)0>
             ).reader_);
  local_30 = (NLHandler<mp::NullNLHandler<int>,_int> *)SVar1.data_;
  local_28 = (NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_mp::internal::VarBoundHandler<TestNLHandler3>_>
              *)SVar1.size_;
  if ((local_c & 4) == 0) {
    SVar1.size_ = (size_t)in_stack_ffffffffffffffb0;
    SVar1.data_ = (char *)local_28;
    NLHandler<mp::NullNLHandler<int>,_int>::OnIntSuffix
              (local_30,SVar1,in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98);
    ReadSuffixValues<mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,mp::internal::VarBoundHandler<TestNLHandler3>>::IntReader,mp::NLHandler<mp::NullNLHandler<int>,int>::IntSuffixHandler>
              (in_stack_ffffffffffffffc0,(int)((ulong)in_stack_ffffffffffffffb8 >> 0x20),
               (int)in_stack_ffffffffffffffb8,(IntSuffixHandler *)in_stack_ffffffffffffffb0);
  }
  else {
    name_00.data_._4_4_ = in_stack_ffffffffffffffac;
    name_00.data_._0_4_ = in_stack_ffffffffffffffa8;
    name_00.size_ = (size_t)in_stack_ffffffffffffffb0;
    NLHandler<mp::NullNLHandler<int>,_int>::OnDblSuffix
              (in_stack_ffffffffffffffa0,name_00,in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98
              );
    ReadSuffixValues<mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,mp::internal::VarBoundHandler<TestNLHandler3>>::DoubleReader,mp::NLHandler<mp::NullNLHandler<int>,int>::DblSuffixHandler>
              (local_28,(int)((ulong)local_30 >> 0x20),(int)local_30,
               (DblSuffixHandler *)in_stack_ffffffffffffffb0);
  }
  return;
}

Assistant:

void NLReader<Reader, Handler>::ReadSuffix(int info) {
  int num_items = ItemInfo(*this).num_items();
  int num_values = ReadUInt(1, num_items + 1);
  fmt::StringRef name = reader_.ReadName();
  reader_.ReadTillEndOfLine();
  suf::Kind kind = static_cast<suf::Kind>(info & internal::SUFFIX_KIND_MASK);
  if ((info & suf::FLOAT) != 0) {
    typename Handler::DblSuffixHandler
        suffix_handler = handler_.OnDblSuffix(name, kind, num_values);
    ReadSuffixValues<DoubleReader>(num_values, num_items, suffix_handler);
  } else {
    typename Handler::IntSuffixHandler
        suffix_handler = handler_.OnIntSuffix(name, kind, num_values);
    ReadSuffixValues<IntReader>(num_values, num_items, suffix_handler);
  }
}